

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

const_iterator __thiscall
phmap::priv::
base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
::find(base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
       *this,key_type *key)

{
  _Rb_tree_const_iterator<std::pair<const_long,_long>_> checker_iter;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  const_iterator tree_iter;
  const_iterator cVar4;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>
  bVar3;
  
  tree_iter = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
              ::find<long>((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                            *)this,key);
  p_Var2 = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  checker_iter._M_node = &(this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var1 = checker_iter._M_node;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      if (*key <= *(long *)(p_Var2 + 1)) {
        p_Var1 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(long *)(p_Var2 + 1) < *key];
    } while (p_Var2 != (_Base_ptr)0x0);
  }
  if ((p_Var1 != checker_iter._M_node) && (*(long *)(p_Var1 + 1) <= *key)) {
    checker_iter._M_node = p_Var1;
  }
  bVar3 = base_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
          ::
          iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>const,std::pair<long_const,long>const&,std::pair<long_const,long>const*>,std::_Rb_tree_const_iterator<std::pair<long_const,long>>>
                    ((base_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
                      *)this,tree_iter,checker_iter);
  cVar4.node = bVar3.node;
  cVar4.position = bVar3.position;
  cVar4._12_4_ = bVar3._12_4_;
  return cVar4;
}

Assistant:

const_iterator find(const key_type &key) const {
        return iter_check(tree_.find(key), checker_.find(key));
    }